

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
ARAPlanner::GetSearchPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ARAPlanner *this,
          ARASearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  uint uVar1;
  int iVar2;
  iterator iVar3;
  void *pvVar4;
  DiscreteSpaceInformation *pDVar5;
  runtime_error *this_00;
  ulong uVar6;
  ulong uVar7;
  CMDPSTATE *__args;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  CMDPSTATE *pCVar12;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  void *local_68;
  long lStack_60;
  long local_58;
  void *local_48;
  long lStack_40;
  long local_38;
  
  local_38 = 0;
  local_48 = (void *)0x0;
  lStack_40 = 0;
  local_58 = 0;
  local_68 = (void *)0x0;
  lStack_60 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->bforwardsearch == true) {
    pCVar12 = pSearchStateSpace->searchgoalstate;
    __args = pSearchStateSpace->searchstartstate;
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2e])(this,pSearchStateSpace);
  }
  else {
    __args = pSearchStateSpace->searchgoalstate;
    pCVar12 = pSearchStateSpace->searchstartstate;
  }
  iVar3._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar3,&__args->StateID);
  }
  else {
    *iVar3._M_current = __args->StateID;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  *solcost = 0;
  if (_stdout == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ERROR: could not open file");
    *(undefined ***)this_00 = &PTR__runtime_error_001574d0;
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = __args->StateID;
  if (uVar1 != pCVar12->StateID) {
    do {
      pvVar4 = __args->PlannerSpecificData;
      if (((pvVar4 == (void *)0x0) || (*(long *)((long)pvVar4 + 0x38) == 0)) ||
         (*(int *)((long)pvVar4 + 0x24) == 1000000000)) break;
      pDVar5 = (this->super_SBPLPlanner).environment_;
      (*pDVar5->_vptr_DiscreteSpaceInformation[5])(pDVar5,(ulong)uVar1,&local_48,&local_68);
      uVar8 = lStack_40 - (long)local_48 >> 2;
      if ((int)(uint)uVar8 < 1) {
        iVar10 = 1000000000;
      }
      else {
        uVar6 = lStack_60 - (long)local_68 >> 2;
        iVar10 = 1000000000;
        uVar11 = 0;
        do {
          uVar7 = uVar8;
          uVar9 = uVar8;
          if (uVar8 == uVar11) {
LAB_00139244:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9,uVar7);
          }
          if (*(int *)((long)local_48 + uVar11 * 4) == **(int **)((long)pvVar4 + 0x38)) {
            uVar7 = uVar6;
            uVar9 = uVar11;
            if (uVar6 <= uVar11) goto LAB_00139244;
            iVar2 = *(int *)((long)local_68 + uVar11 * 4);
            if (iVar2 < iVar10) {
              iVar10 = iVar2;
            }
          }
          uVar11 = uVar11 + 1;
        } while (((uint)uVar8 & 0x7fffffff) != uVar11);
      }
      *solcost = *solcost + iVar10;
      __args = *(CMDPSTATE **)((long)pvVar4 + 0x38);
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar3,&__args->StateID)
        ;
      }
      else {
        *iVar3._M_current = __args->StateID;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar1 = __args->StateID;
    } while (uVar1 != pCVar12->StateID);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> ARAPlanner::GetSearchPath(ARASearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ARAState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        ReconstructPath(pSearchStateSpace);
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    while (state->StateID != goalstate->StateID) {
        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ARAState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) {
                actioncost = CostV.at(i);
            }
        }
        if (actioncost == INFINITECOST) SBPL_PRINTF("WARNING: actioncost = %d\n", actioncost);

        solcost += actioncost;

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

#if DEBUG
        ARAState* nextstateinfo = (ARAState*)(searchstateinfo->bestnextstate->PlannerSpecificData);
        if (actioncost != abs((int)(searchstateinfo->g - nextstateinfo->g)) &&
            pSearchStateSpace->eps_satisfied <= 1.001)
        {
            SBPL_FPRINTF(fDeb, "ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                         actioncost, abs((int)(searchstateinfo->g - nextstateinfo->g)));
            SBPL_ERROR("ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                       actioncost,abs((int)(searchstateinfo->g - nextstateinfo->g)));
            PrintSearchState(searchstateinfo, fDeb);
            PrintSearchState(nextstateinfo, fDeb);
        }
#endif

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    return wholePathIds;
}